

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReaderCache::processMru(PtexReaderCache *this)

{
  PtexLruItem *pPVar1;
  bool bVar2;
  size_t sVar3;
  PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_openFilesItem> *in_RDI;
  bool shouldPruneData;
  bool shouldPruneFiles;
  size_t blockReads;
  size_t opens;
  PtexCachedReader *reader;
  int i;
  size_t filesOpenChange;
  size_t memUsedChange;
  MruList *mruList;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar4;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  PtexReaderCache *in_stack_ffffffffffffffa0;
  PtexReaderCache *in_stack_ffffffffffffffb0;
  int local_44;
  
  bVar2 = Mutex::trylock((Mutex *)0x979fff);
  if (bVar2) {
    if (*(int *)&(in_RDI[0x48]._end._prev)->_prev < 0x32) {
      Mutex::unlock((Mutex *)0x97a02c);
    }
    else {
      pPVar1 = in_RDI[0x48]._end._prev;
      in_RDI[0x48]._end._prev = in_RDI[0x48]._end._next;
      in_RDI[0x48]._end._next = pPVar1;
      for (local_44 = 0; local_44 < 0x32; local_44 = local_44 + 1) {
        do {
          in_stack_ffffffffffffffb0 = (PtexReaderCache *)(&pPVar1->_next)[local_44];
        } while (in_stack_ffffffffffffffb0 == (PtexReaderCache *)0x0);
        (&pPVar1->_next)[local_44] = (PtexLruItem *)0x0;
        PtexCachedReader::getMemUsedChange((PtexCachedReader *)in_stack_ffffffffffffffb0);
        sVar3 = PtexCachedReader::getOpensChange((PtexCachedReader *)in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffffa0 =
             (PtexReaderCache *)
             PtexCachedReader::getBlockReadsChange((PtexCachedReader *)in_stack_ffffffffffffffb0);
        if ((sVar3 != 0) || (in_stack_ffffffffffffffa0 != (PtexReaderCache *)0x0)) {
          in_RDI[0x4c]._end._prev = (PtexLruItem *)((long)&(in_RDI[0x4c]._end._prev)->_prev + sVar3)
          ;
          in_RDI[0x4c]._end._next =
               (PtexLruItem *)
               ((long)&(in_RDI[0x4c]._end._next)->_prev +
               (long)&in_stack_ffffffffffffffa0->super_PtexCache);
          PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_openFilesItem>::
          push(in_RDI,(PtexCachedReader *)
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        }
        if (((PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
              *)in_RDI)[1]._end._prev != (PtexLruItem *)0x0) {
          PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
          ::push((PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
                  *)in_RDI,
                 (PtexCachedReader *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        }
      }
      *(undefined4 *)&pPVar1->_prev = 0;
      adjustMemUsed(in_stack_ffffffffffffffa0,
                    CONCAT17(in_stack_ffffffffffffff9f,
                             CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
      adjustFilesOpen(in_stack_ffffffffffffffa0,
                      CONCAT17(in_stack_ffffffffffffff9f,
                               CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
      bVar4 = false;
      if (in_RDI[1]._end._prev != (PtexLruItem *)0x0) {
        bVar4 = in_RDI[1]._end._prev < in_RDI[9]._end._prev;
      }
      if ((in_RDI->_end)._next < in_RDI[0xd]._end._prev) {
        pruneFiles(in_stack_ffffffffffffffa0);
      }
      if ((bVar4 & 1) != 0) {
        pruneData(in_stack_ffffffffffffffb0);
      }
      Mutex::unlock((Mutex *)0x97a24f);
    }
  }
  return;
}

Assistant:

void PtexReaderCache::processMru()
{
    // use a non-blocking lock so we can proceed as soon as space has been freed in the mru list
    // (which happens almost immediately in the processMru thread that has the lock)
    if (!_mruLock.trylock()) return;
    if (_mruList->next < numMruFiles) {
        _mruLock.unlock();
        return;
    }

    // switch mru buffers and reset slot counter so other threads can proceed immediately
    MruList* mruList = _mruList;
    AtomicStore(&_mruList, _prevMruList);
    _prevMruList = mruList;

    // extract relevant stats and add to open/active list
    size_t memUsedChange = 0, filesOpenChange = 0;
    for (int i = 0; i < numMruFiles; ++i) {
        PtexCachedReader* reader;
        do { reader = mruList->files[i]; } while (!reader); // loop on (unlikely) race condition
        mruList->files[i] = 0;
        memUsedChange += reader->getMemUsedChange();
        size_t opens = reader->getOpensChange();
        size_t blockReads = reader->getBlockReadsChange();
        filesOpenChange += opens;
        if (opens || blockReads) {
            _fileOpens += opens;
            _blockReads += blockReads;
            _openFiles.push(reader);
        }
        if (_maxMem) {
            _activeFiles.push(reader);
        }
    }
    AtomicStore(&mruList->next, 0);
    adjustMemUsed(memUsedChange);
    adjustFilesOpen(filesOpenChange);

    bool shouldPruneFiles = _filesOpen > _maxFiles;
    bool shouldPruneData = _maxMem && _memUsed > _maxMem;

    if (shouldPruneFiles) {
        pruneFiles();
    }
    if (shouldPruneData) {
        pruneData();
    }
    _mruLock.unlock();
}